

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.hpp
# Opt level: O2

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::PreparedStatement::ExecuteRecursive<char_const*>
          (PreparedStatement *this,vector<duckdb::Value,_true> *values,char *value)

{
  Value local_60 [64];
  
  duckdb::Value::CreateValue<char_const*>((char *)local_60);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)value,local_60);
  duckdb::Value::~Value(local_60);
  ExecuteRecursive(this,values);
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> ExecuteRecursive(vector<Value> &values, T value, ARGS... args) {
		values.push_back(Value::CreateValue<T>(value));
		return ExecuteRecursive(values, args...);
	}